

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O1

bool __thiscall
google::protobuf::internal::WireFormatLite::
ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)18>
          (WireFormatLite *this,CodedInputStream *input,int64_t *value)

{
  char cVar1;
  char *pcVar2;
  pair<unsigned_long,_bool> pVar3;
  
  pcVar2 = *(char **)this;
  if ((pcVar2 < *(char **)(this + 8)) && (cVar1 = *pcVar2, -1 < (long)cVar1)) {
    *(char **)this = pcVar2 + 1;
    pVar3._8_8_ = 1;
    pVar3.first = (long)cVar1;
  }
  else {
    pVar3 = io::CodedInputStream::ReadVarint64Fallback((CodedInputStream *)this);
  }
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    input->buffer_ = (uint8_t *)(-(ulong)((uint)pVar3.first & 1) ^ pVar3.first >> 1);
  }
  return (bool)(pVar3.second & 1);
}

Assistant:

inline bool WireFormatLite::ReadPrimitive<int64_t, WireFormatLite::TYPE_SINT64>(
    io::CodedInputStream* input, int64_t* value) {
  uint64_t temp;
  if (!input->ReadVarint64(&temp)) return false;
  *value = ZigZagDecode64(temp);
  return true;
}